

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O2

void rw::syncLTMRecurse(Frame *frame,uint8 hierarchyFlags)

{
  uint8 *puVar1;
  
  for (; frame != (Frame *)0x0; frame = frame->next) {
    hierarchyFlags = hierarchyFlags | (frame->object).privateFlags;
    if ((hierarchyFlags & 4) != 0) {
      Matrix::mult(&frame->ltm,&frame->matrix,(Matrix *)((long)(frame->object).parent + 0x70));
      puVar1 = &(frame->object).privateFlags;
      *puVar1 = *puVar1 & 0xfb;
    }
    syncLTMRecurse(frame->child,hierarchyFlags);
  }
  return;
}

Assistant:

static void
syncLTMRecurse(Frame *frame, uint8 hierarchyFlags)
{
	for(; frame; frame = frame->next){
		// If frame is dirty or any parent was dirty, update LTM
		hierarchyFlags |= frame->object.privateFlags;
		if(hierarchyFlags & Frame::SUBTREESYNCLTM){
			Matrix::mult(&frame->ltm, &frame->matrix,
			             &frame->getParent()->ltm);
			frame->object.privateFlags &= ~Frame::SUBTREESYNCLTM;
		}
		// And synch all children
		syncLTMRecurse(frame->child, hierarchyFlags);
	}
}